

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool __thiscall
TimesAll<0,0,0>::propagate_xy_max<0,0>
          (TimesAll<0,0,0> *this,IntView<0> u,IntView<0> v,int64_t v_min,int64_t v_max,int64_t z_min
          ,int64_t z_max)

{
  int iVar1;
  long lVar2;
  Clause *this_00;
  Lit *pLVar3;
  IntVar *pIVar4;
  ulong uVar5;
  Clause *pCVar6;
  IntVar *pIVar7;
  ulong uVar8;
  
  pIVar4 = v.var;
  pIVar7 = u.var;
  if (v_max < 1 || -1 < v_min) {
    if (v_max < 0) {
      z_max = z_min;
    }
    if (z_min < 1) {
      v_min = v_max;
    }
    uVar8 = z_max / v_min;
  }
  else {
    uVar5 = -z_min;
    if (0 < z_min) {
      uVar5 = z_min;
    }
    if ((long)uVar5 <= z_max) {
      uVar5 = z_max;
    }
    uVar8 = -z_max;
    if (uVar5 != uVar8 && SBORROW8(uVar5,uVar8) == (long)(uVar5 + z_max) < 0) {
      uVar8 = uVar5;
    }
  }
  lVar2 = (long)(pIVar7->max).v;
  pCVar6 = (Clause *)0x1;
  if ((long)uVar8 < lVar2) {
    if (so.lazy) {
      this_00 = Reason_new(5);
      iVar1 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[8])(pIVar4);
      pLVar3 = Clause::operator[](this_00,1);
      pLVar3->x = iVar1;
      iVar1 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[9])(pIVar4);
      pLVar3 = Clause::operator[](this_00,2);
      pLVar3->x = iVar1;
      iVar1 = (**(code **)(**(long **)(this + 0x38) + 0x40))();
      pLVar3 = Clause::operator[](this_00,3);
      pLVar3->x = iVar1;
      iVar1 = (**(code **)(**(long **)(this + 0x38) + 0x48))();
      pLVar3 = Clause::operator[](this_00,4);
      pLVar3->x = iVar1;
      lVar2 = (long)(pIVar7->max).v;
    }
    else {
      this_00 = (Clause *)0x0;
    }
    uVar8 = -(ulong)(uVar8 == 0) | uVar8;
    if ((long)uVar8 < lVar2) {
      pCVar6 = (Clause *)0x0;
      if (so.lazy == false) {
        this_00 = pCVar6;
      }
      iVar1 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xf])(pIVar7,uVar8,this_00,1);
      if ((char)iVar1 == '\0') goto LAB_0018c0b4;
    }
    pCVar6 = (Clause *)0x1;
  }
LAB_0018c0b4:
  return SUB81(pCVar6,0);
}

Assistant:

bool propagate_xy_max(IntView<U> u, IntView<V> v, const int64_t v_min, const int64_t v_max,
												const int64_t z_min, const int64_t z_max) {
		assert(z_min > 0 || z_max < 0);
		assert(v_min != 0 && v_max != 0);
		// The product z cannot be 0. Then x and y cannot be 0, too.
		// u <= floor(z / v)
		int64_t u_max_new = 0;
		if (v_min < 0 && v_max > 0) {
			// The domain of integer variable v contains -1 and 1
			u_max_new = std::max(-1 * z_min, z_min);
			u_max_new = std::max(u_max_new, z_max);
			u_max_new = std::max(u_max_new, -1 * z_max);
		} else {
			u_max_new = (v_max < 0 ? z_min : z_max) / (z_min > 0 ? v_min : v_max);
		}

		if (u_max_new < u.getMax()) {
			// TODO Better explanation
			Clause* reason = nullptr;
			if (so.lazy) {
				reason = Reason_new(5);
				(*reason)[1] = v.getMinLit();
				(*reason)[2] = v.getMaxLit();
				(*reason)[3] = z.getMinLit();
				(*reason)[4] = z.getMaxLit();
			}
			setDom(u, setMax, (u_max_new == 0 ? -1 : u_max_new), reason);
		}

		return true;
	}